

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O0

void __thiscall
agg::curve3_div::recursive_bezier
          (curve3_div *this,double x1,double y1,double x2,double y2,double x3,double y3,uint level)

{
  double dVar1;
  double dVar2;
  point_base<double> local_c8;
  point_base<double> local_b8;
  point_base<double> local_a8;
  double local_98;
  double da;
  double d;
  double dy;
  double dx;
  double y123;
  double x123;
  double y23;
  double x23;
  double y12;
  double x12;
  double dStack_40;
  uint level_local;
  double y3_local;
  double x3_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  curve3_div *this_local;
  
  if (0x20 < level) {
    return;
  }
  y12 = (x1 + x2) / 2.0;
  x23 = (y1 + y2) / 2.0;
  y23 = (x2 + x3) / 2.0;
  x123 = (y2 + y3) / 2.0;
  y123 = (y12 + y23) / 2.0;
  dx = (x23 + x123) / 2.0;
  dy = x3 - x1;
  d = y3 - y1;
  da = ABS((x2 - x3) * d + -((y2 - y3) * dy));
  x12._4_4_ = level;
  dStack_40 = y3;
  y3_local = x3;
  x3_local = y2;
  y2_local = x2;
  x2_local = y1;
  y1_local = x1;
  x1_local = (double)this;
  if (da <= 1e-30) {
    local_98 = dy * dy + d * d;
    if ((local_98 != 0.0) || (NAN(local_98))) {
      da = ((x2 - x1) * dy + (y2 - y1) * d) / local_98;
      if ((0.0 < da) && (da < 1.0)) {
        return;
      }
      if (0.0 < da) {
        if (da < 1.0) {
          da = calc_sq_distance(x2,y2,da * dy + x1,da * d + y1);
        }
        else {
          da = calc_sq_distance(x2,y2,x3,y3);
        }
      }
      else {
        da = calc_sq_distance(x2,y2,x1,y1);
      }
    }
    else {
      da = calc_sq_distance(x1,y1,x2,y2);
    }
    if (da < *(double *)(this + 8)) {
      point_base<double>::point_base(&local_c8,y2_local,x3_local);
      pod_bvector<agg::point_base<double>,_6U>::add
                ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),&local_c8);
      return;
    }
  }
  else if (da * da <= *(double *)(this + 8) * (dy * dy + d * d)) {
    if (*(double *)(this + 0x10) <= 0.01 && *(double *)(this + 0x10) != 0.01) {
      point_base<double>::point_base(&local_a8,y123,dx);
      pod_bvector<agg::point_base<double>,_6U>::add
                ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),&local_a8);
      return;
    }
    dVar1 = atan2(y3 - y2,x3 - x2);
    dVar2 = atan2(x3_local - x2_local,y2_local - y1_local);
    local_98 = ABS(dVar1 - dVar2);
    if (3.141592653589793 <= local_98) {
      local_98 = 6.283185307179586 - local_98;
    }
    if (local_98 < *(double *)(this + 0x10)) {
      point_base<double>::point_base(&local_b8,y123,dx);
      pod_bvector<agg::point_base<double>,_6U>::add
                ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),&local_b8);
      return;
    }
  }
  recursive_bezier(this,y1_local,x2_local,y12,x23,y123,dx,x12._4_4_ + 1);
  recursive_bezier(this,y123,dx,y23,x123,y3_local,dStack_40,x12._4_4_ + 1);
  return;
}

Assistant:

void curve3_div::recursive_bezier(double x1, double y1, 
                                      double x2, double y2, 
                                      double x3, double y3,
                                      unsigned level)
    {
        if(level > curve_recursion_limit) 
        {
            return;
        }

        // Calculate all the mid-points of the line segments
        //----------------------
        double x12   = (x1 + x2) / 2;                
        double y12   = (y1 + y2) / 2;
        double x23   = (x2 + x3) / 2;
        double y23   = (y2 + y3) / 2;
        double x123  = (x12 + x23) / 2;
        double y123  = (y12 + y23) / 2;

        double dx = x3-x1;
        double dy = y3-y1;
        double d = fabs(((x2 - x3) * dy - (y2 - y3) * dx));
        double da;

        if(d > curve_collinearity_epsilon)
        { 
            // Regular case
            //-----------------
            if(d * d <= m_distance_tolerance_square * (dx*dx + dy*dy))
            {
                // If the curvature doesn't exceed the distance_tolerance value
                // we tend to finish subdivisions.
                //----------------------
                if(m_angle_tolerance < curve_angle_tolerance_epsilon)
                {
                    m_points.add(point_d(x123, y123));
                    return;
                }

                // Angle & Cusp Condition
                //----------------------
                da = fabs(atan2(y3 - y2, x3 - x2) - atan2(y2 - y1, x2 - x1));
                if(da >= pi) da = 2*pi - da;

                if(da < m_angle_tolerance)
                {
                    // Finally we can stop the recursion
                    //----------------------
                    m_points.add(point_d(x123, y123));
                    return;                 
                }
            }
        }
        else
        {
            // Collinear case
            //------------------
            da = dx*dx + dy*dy;
            if(da == 0)
            {
                d = calc_sq_distance(x1, y1, x2, y2);
            }
            else
            {
                d = ((x2 - x1)*dx + (y2 - y1)*dy) / da;
                if(d > 0 && d < 1)
                {
                    // Simple collinear case, 1---2---3
                    // We can leave just two endpoints
                    return;
                }
                     if(d <= 0) d = calc_sq_distance(x2, y2, x1, y1);
                else if(d >= 1) d = calc_sq_distance(x2, y2, x3, y3);
                else            d = calc_sq_distance(x2, y2, x1 + d*dx, y1 + d*dy);
            }
            if(d < m_distance_tolerance_square)
            {
                m_points.add(point_d(x2, y2));
                return;
            }
        }

        // Continue subdivision
        //----------------------
        recursive_bezier(x1, y1, x12, y12, x123, y123, level + 1); 
        recursive_bezier(x123, y123, x23, y23, x3, y3, level + 1); 
    }